

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall
Clasp::mt::ParallelSolve::ParallelSolve(ParallelSolve *this,ParallelSolveOptions *opts)

{
  _func_int **pp_Var1;
  ParallelSolve *in_RSI;
  SolveLimits *in_RDI;
  SharedData *unaff_retaddr;
  ParallelSolve *this_00;
  ScheduleStrategy *in_stack_ffffffffffffffe0;
  uint32 in_stack_ffffffffffffffec;
  
  SolveAlgorithm::SolveAlgorithm((SolveAlgorithm *)unaff_retaddr,in_RDI);
  in_RDI->conflicts = (uint64)&PTR__ParallelSolve_002df208;
  this_00 = (ParallelSolve *)&in_RDI[6].restarts;
  pp_Var1 = (_func_int **)operator_new(0x160);
  SharedData::SharedData(unaff_retaddr);
  (this_00->super_SolveAlgorithm)._vptr_SolveAlgorithm = pp_Var1;
  in_RDI[7].conflicts = 0;
  in_RDI[7].restarts = *(uint64 *)((long)&(in_RSI->super_SolveAlgorithm).limits_.restarts + 4);
  *(undefined4 *)&in_RDI[8].conflicts = 0;
  *(uint *)((long)&in_RDI[8].conflicts + 4) =
       *(uint *)((long)&in_RDI[8].conflicts + 4) & 0xc0000000 | 0x400;
  *(uint *)((long)&in_RDI[8].conflicts + 4) =
       *(uint *)((long)&in_RDI[8].conflicts + 4) & 0x3fffffff |
       (uint)(in_RSI->super_SolveAlgorithm).limits_.restarts & 0xc0000000;
  *(undefined4 *)&in_RDI[8].restarts = 9;
  *(bool *)((long)&in_RDI[8].restarts + 4) =
       *(int *)((long)&(in_RSI->super_SolveAlgorithm).path_.ptr_ + 4) == 0;
  setRestarts(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe0);
  setIntegrate(this_00,(uint32)((ulong)in_RDI >> 0x20),(uint8)((ulong)in_RDI >> 0x18));
  return;
}

Assistant:

ParallelSolve::ParallelSolve(const ParallelSolveOptions& opts)
	: SolveAlgorithm(opts.limit)
	, shared_(new SharedData)
	, thread_(0)
	, distribution_(opts.distribute)
	, maxRestarts_(0)
	, intGrace_(1024)
	, intTopo_(opts.integrate.topo)
	, intFlags_(ClauseCreator::clause_not_root_sat | ClauseCreator::clause_no_add)
	, modeSplit_(opts.algorithm.mode == ParallelSolveOptions::Algorithm::mode_split) {
	setRestarts(opts.restarts.maxR, opts.restarts.sched);
	setIntegrate(opts.integrate.grace, opts.integrate.filter);
}